

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall rapic::header::get_real_array(header *this)

{
  runtime_error *this_00;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar1;
  double val;
  char *end;
  char *pos;
  vector<double,_std::allocator<double>_> *ret;
  vector<double,_std::allocator<double>_> *this_01;
  char *local_28;
  char *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11176f);
  local_20 = (char *)std::__cxx11::string::c_str();
  do {
    while( true ) {
      if (*local_20 == '\0') {
        return this_01;
      }
      dVar1 = strtod(local_20,&local_28);
      if (((dVar1 == 0.0) && (!NAN(dVar1))) && (local_28 == local_20)) break;
      std::vector<double,_std::allocator<double>_>::push_back
                (this_01,(value_type_conflict1 *)in_RDI);
      local_20 = local_28;
    }
    for (; *local_20 == ' '; local_20 = local_20 + 1) {
    }
  } while (*local_20 == '\0');
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"bad double value");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto header::get_real_array() const -> std::vector<double>
{
  std::vector<double> ret;
  auto pos = value_.c_str();
  while (*pos != '\0')
  {
    char* end;
    auto val = strtod(pos, &end);

    // did the conversion fail?
    if (val == 0 && end == pos)
    {
      // check if it is just trailing spaces
      while (*pos == ' ')
        ++pos;
      if (*pos != '\0')
        throw std::runtime_error{"bad double value"};
    }
    else
    {
      ret.push_back(val);
      pos = end;
    }
  }
  return ret;
}